

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddEssent.c
# Opt level: O0

void bitVectorSet(BitVector *vector,int i,short val)

{
  int iVar1;
  byte bVar2;
  int bit;
  int word;
  short val_local;
  int i_local;
  BitVector *vector_local;
  
  iVar1 = i >> 6;
  bVar2 = (byte)i & 0x3f;
  vector[iVar1] = (1L << bVar2 ^ 0xffffffffffffffffU) & vector[iVar1];
  vector[iVar1] = (long)val << bVar2 | vector[iVar1];
  return;
}

Assistant:

DD_INLINE
static void
bitVectorSet(
  BitVector * vector,
  int i,
  short val)
{
    int word, bit;

    word = i >> LOGBPL;
    bit = i & (BPL - 1);
    vector[word] &= ~(1L << bit);
    vector[word] |= (((long) val) << bit);

}